

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

UnifiedCache * icu_63::UnifiedCache::getInstance(UErrorCode *status)

{
  UBool UVar1;
  UErrorCode UVar2;
  UnifiedCache *pUVar3;
  code *size;
  
  if (U_ZERO_ERROR < *status) goto LAB_002d73c0;
  if ((gCacheInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar1 = umtx_initImplPreInit(&gCacheInitOnce), UVar1 == '\0')) {
    if (U_ZERO_ERROR < gCacheInitOnce.fErrCode) {
      *status = gCacheInitOnce.fErrCode;
    }
    goto LAB_002d73c0;
  }
  size = unifiedcache_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_UNIFIED_CACHE,unifiedcache_cleanup);
  pUVar3 = (UnifiedCache *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
  if (pUVar3 == (UnifiedCache *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    UVar2 = U_MEMORY_ALLOCATION_ERROR;
LAB_002d73a3:
    gCache = (UnifiedCache *)0x0;
  }
  else {
    UnifiedCache(pUVar3,status);
    UVar2 = *status;
    gCache = pUVar3;
    if (U_ZERO_ERROR < UVar2) {
      (*(pUVar3->super_UnifiedCacheBase).super_UObject._vptr_UObject[1])(pUVar3);
      UVar2 = *status;
      goto LAB_002d73a3;
    }
  }
  gCacheInitOnce.fErrCode = UVar2;
  umtx_initImplPostInit(&gCacheInitOnce);
LAB_002d73c0:
  pUVar3 = gCache;
  if (U_ZERO_ERROR < *status) {
    pUVar3 = (UnifiedCache *)0x0;
  }
  return pUVar3;
}

Assistant:

UnifiedCache *UnifiedCache::getInstance(UErrorCode &status) {
    umtx_initOnce(gCacheInitOnce, &cacheInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    U_ASSERT(gCache != NULL);
    return gCache;
}